

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFloatStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::FloatStateQueryVerifiers::GetInteger64Verifier::verifyFloat2Expanded
          (GetInteger64Verifier *this,TestContext *testCtx,GLenum name,GLfloat reference0,
          GLfloat reference1)

{
  ostringstream *this_00;
  deUint64 dVar1;
  bool bVar2;
  deUint64 dVar3;
  long lVar4;
  deUint64 dVar5;
  long lVar6;
  deUint64 dVar7;
  StateQueryMemoryWriteGuard<long[2]> floatVector2;
  Hex<16UL> local_1f8;
  GLfloat local_1f0;
  GLfloat local_1ec;
  StateQueryMemoryWriteGuard<long[2]> local_1e8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_1e8.m_postguard[0] = -0x2121212121212122;
  local_1e8.m_postguard[1] = -0x2121212121212122;
  local_1e8.m_value[0] = 0xdededededededede;
  local_1e8.m_value[1] = 0xdededededededede;
  local_1e8.m_preguard[0] = -0x2121212121212122;
  local_1e8.m_preguard[1] = -0x2121212121212122;
  local_1f0 = reference0;
  local_1ec = reference1;
  glu::CallLogWrapper::glGetInteger64v
            (&(this->super_StateVerifier).super_CallLogWrapper,name,local_1e8.m_value);
  bVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long[2]>::verifyValidity
                    (&local_1e8,testCtx);
  if (bVar2) {
    lVar4 = (long)((local_1f0 * 4.2949673e+09 + -1.0) * 0.5);
    dVar1 = lVar4 - 0x7ff;
    lVar6 = (long)((local_1ec * 4.2949673e+09 + -1.0) * 0.5);
    dVar3 = lVar6 - 0x7ff;
    dVar5 = lVar4 + 0x7ff;
    dVar7 = lVar6 + 0x7ff;
    if (((long)dVar5 < local_1e8.m_value[0] || local_1e8.m_value[0] < (long)dVar1) ||
       (local_1e8.m_value[1] < (long)dVar3 || (long)dVar7 < local_1e8.m_value[1])) {
      local_1b0._0_8_ = testCtx->m_log;
      this_00 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"// ERROR: expected in ranges ",0x1d);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"[",1);
      local_1f8.value = dVar1;
      tcu::Format::Hex<16UL>::toStream(&local_1f8,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
      local_1f8.value = dVar5;
      tcu::Format::Hex<16UL>::toStream(&local_1f8,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"], ",3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"[",1);
      local_1f8.value = dVar3;
      tcu::Format::Hex<16UL>::toStream(&local_1f8,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
      local_1f8.value = dVar7;
      tcu::Format::Hex<16UL>::toStream(&local_1f8,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"]",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"; got ",6);
      local_1f8.value = local_1e8.m_value[0];
      tcu::Format::Hex<16UL>::toStream(&local_1f8,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
      local_1f8.value = local_1e8.m_value[1];
      tcu::Format::Hex<16UL>::toStream(&local_1f8,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_138);
      if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid integer value");
      }
    }
  }
  return;
}

Assistant:

void GetInteger64Verifier::verifyFloat2Expanded (tcu::TestContext& testCtx, GLenum name, GLfloat reference0, GLfloat reference1)
{
	DE_ASSERT(de::inRange(reference0, -1.0f, 1.0f));
	DE_ASSERT(de::inRange(reference1, -1.0f, 1.0f));

	using tcu::TestLog;
	using tcu::toHex;

	const GLint64 referenceAsGLintMin[] =
	{
		expandGLFloatToInteger(reference0) - FLOAT_EXPANSION_E_64,
		expandGLFloatToInteger(reference1) - FLOAT_EXPANSION_E_64
	};
	const GLint64 referenceAsGLintMax[] =
	{
		expandGLFloatToInteger(reference0) + FLOAT_EXPANSION_E_64,
		expandGLFloatToInteger(reference1) + FLOAT_EXPANSION_E_64
	};

	StateQueryMemoryWriteGuard<GLint64[2]> floatVector2;
	glGetInteger64v(name, floatVector2);

	if (!floatVector2.verifyValidity(testCtx))
		return;

	if (floatVector2[0] < referenceAsGLintMin[0] || floatVector2[0] > referenceAsGLintMax[0] ||
		floatVector2[1] < referenceAsGLintMin[1] || floatVector2[1] > referenceAsGLintMax[1])
	{
		testCtx.getLog() << TestLog::Message
			<< "// ERROR: expected in ranges "
			<< "[" << toHex(referenceAsGLintMin[0]) << " " << toHex(referenceAsGLintMax[0]) << "], "
			<< "[" << toHex(referenceAsGLintMin[1]) << " " << toHex(referenceAsGLintMax[1]) << "]"
			<< "; got "
			<< toHex(floatVector2[0]) << ", "
			<< toHex(floatVector2[1]) << " "<< TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid integer value");
	}
}